

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_nor_i64_riscv32(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGOp *pTVar1;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 pTVar2;
  
  pTVar2 = ret + (long)tcg_ctx;
  pTVar1 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_or_i64);
  pTVar1->args[0] = (TCGArg)pTVar2;
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
  pTVar1 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_not_i64);
  pTVar1->args[0] = (TCGArg)pTVar2;
  pTVar1->args[1] = (TCGArg)pTVar2;
  return;
}

Assistant:

void tcg_gen_nor_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_nor_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), TCGV_LOW(tcg_ctx, arg2));
        tcg_gen_nor_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), TCGV_HIGH(tcg_ctx, arg2));
#elif TCG_TARGET_HAS_nor_i64
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_nor_i64, ret, arg1, arg2);
#else
        tcg_gen_or_i64(tcg_ctx, ret, arg1, arg2);
        tcg_gen_not_i64(tcg_ctx, ret, ret);
#endif
}